

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_DataBlock(VGMPlayer *this)

{
  UINT8 UVar1;
  uint dataLen_00;
  UINT32 memSize_00;
  byte bVar2;
  UINT16 UVar3;
  UINT32 UVar4;
  size_type sVar5;
  UINT8 *pUVar6;
  ulong __n;
  reference pvVar7;
  CHIP_DEVICE *pCVar8;
  uint local_90;
  UINT32 curPos;
  allocator<unsigned_char> local_79;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> swpData;
  undefined1 auStack_58 [3];
  UINT8 retVal;
  UINT32 oldLen;
  PCM_CDB_INF dbCI;
  PCM_BANK *pcmBnk;
  CHIP_DEVICE *cDev;
  UINT8 *dataPtr;
  UINT32 local_20;
  UINT32 dataLen;
  UINT32 dataOfs;
  UINT32 memSize;
  UINT32 dblkLen;
  UINT8 chipID;
  UINT8 chipType;
  UINT8 dblkType;
  VGMPlayer *this_local;
  
  memSize._3_1_ = this->_fileData[(ulong)this->_filePos + 2];
  _dblkLen = this;
  UVar4 = ReadLE32(this->_fileData + (ulong)this->_filePos + 3);
  memSize._1_1_ = (byte)(UVar4 >> 0x1f);
  dataOfs = UVar4 & 0x7fffffff;
  this->_filePos = this->_filePos + 7;
  bVar2 = memSize._3_1_ & 0xc0;
  if (((memSize._3_1_ & 0xc0) == 0) || (bVar2 == 0x40)) {
    if (this->_curLoop != 0) {
      return;
    }
    if (memSize._3_1_ == 0x7f) {
      ReadPCMComprTable(dataOfs,this->_fileData + this->_filePos,&this->_pcmComprTbl);
    }
    else {
      dbCI.cmprInfo.comprTbl = (PCM_COMPR_TBL *)(this->_pcmBank + (int)(memSize._3_1_ & 0x3f));
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         dbCI.cmprInfo.comprTbl);
      swpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)sVar5;
      dataPtr._4_4_ = dataOfs;
      pUVar6 = this->_fileData + this->_filePos;
      if ((memSize._3_1_ & 0x40) != 0) {
        ReadComprDataBlkHdr(dataOfs,pUVar6,(PCM_CDB_INF *)auStack_58);
        dbCI.cmprInfo._0_8_ = &this->_pcmComprTbl;
        dataPtr._4_4_ = oldLen;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &dbCI.cmprInfo.comprTbl[1].values,
                 (value_type_conflict2 *)
                 ((long)&swpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(dbCI.cmprInfo.comprTbl + 3)
                 ,(value_type_conflict2 *)((long)&dataPtr + 4));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)dbCI.cmprInfo.comprTbl,
                 (ulong)(swpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + dataPtr._4_4_));
      UVar4 = dataPtr._4_4_;
      if ((memSize._3_1_ & 0x40) == 0) {
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            dbCI.cmprInfo.comprTbl,
                            (ulong)swpData.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        memcpy(pvVar7,pUVar6,(ulong)dataPtr._4_4_);
      }
      else {
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            dbCI.cmprInfo.comprTbl,
                            (ulong)swpData.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        swpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ =
             DecompressDataBlk(UVar4,pvVar7,dataOfs - _auStack_58,pUVar6 + _auStack_58,
                               (PCM_CMP_INF *)&dbCI);
        if (swpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._3_1_ == '\x10') {
          emu_logf(&this->_logger,'\x01',
                   "Error loading table-compressed data block! No table loaded!\n");
        }
        else if (swpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._3_1_ == '\x11') {
          emu_logf(&this->_logger,'\x01',"Data block and loaded value table incompatible!\n");
        }
        else if (swpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._3_1_ == 0x80) {
          emu_logf(&this->_logger,'\x01',"Unknown data block compression!\n");
        }
      }
    }
  }
  else if (bVar2 == 0x80) {
    memSize._2_1_ = _VGM_ROM_CHIPS[(int)(memSize._3_1_ & 0x3f)][0];
    pCVar8 = GetDevicePtr(this,memSize._2_1_,memSize._1_1_);
    if (pCVar8 != (CHIP_DEVICE *)0x0) {
      dataLen = ReadLE32(this->_fileData + this->_filePos);
      local_20 = ReadLE32(this->_fileData + (ulong)this->_filePos + 4);
      pUVar6 = this->_fileData + (ulong)this->_filePos + 8;
      dataPtr._4_4_ = dataOfs - 8;
      if (((memSize._2_1_ == '\x1c') && (dataPtr._4_4_ != 0)) && ((pCVar8->flags & 1) != 0)) {
        dataPtr._4_4_ = dataPtr._4_4_ & 0xfffffffe;
        __n = (ulong)dataPtr._4_4_;
        std::allocator<unsigned_char>::allocator(&local_79);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,__n,&local_79);
        std::allocator<unsigned_char>::~allocator(&local_79);
        for (local_90 = 0; memSize_00 = dataLen, UVar4 = local_20, dataLen_00 = dataPtr._4_4_,
            local_90 < dataPtr._4_4_; local_90 = local_90 + 2) {
          UVar1 = pUVar6[local_90 + 1];
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
                              (ulong)local_90);
          *pvVar7 = UVar1;
          UVar1 = pUVar6[local_90];
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
                              (ulong)(local_90 + 1));
          *pvVar7 = UVar1;
        }
        UVar1 = _VGM_ROM_CHIPS[memSize._3_1_ & 0x3f][1];
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,0);
        WriteChipROM(pCVar8,UVar1,memSize_00,UVar4,dataLen_00,pvVar7);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
      }
      else {
        WriteChipROM(pCVar8,_VGM_ROM_CHIPS[(int)(memSize._3_1_ & 0x3f)][1],dataLen,local_20,
                     dataPtr._4_4_,pUVar6);
      }
    }
  }
  else if (bVar2 == 0xc0) {
    memSize._2_1_ = _VGM_RAM_CHIPS[(int)(memSize._3_1_ & 0x3f)];
    pCVar8 = GetDevicePtr(this,memSize._2_1_,memSize._1_1_);
    if ((pCVar8 != (CHIP_DEVICE *)0x0) && (pCVar8->romWrite != (DEVFUNC_WRITE_BLOCK)0x0)) {
      if ((memSize._3_1_ & 0x20) == 0) {
        UVar3 = ReadLE16(this->_fileData + this->_filePos);
        local_20 = (UINT32)UVar3;
        dataPtr._4_4_ = dataOfs - 2;
        cDev = (CHIP_DEVICE *)(this->_fileData + (ulong)this->_filePos + 2);
      }
      else {
        local_20 = ReadLE32(this->_fileData + this->_filePos);
        dataPtr._4_4_ = dataOfs - 4;
        cDev = (CHIP_DEVICE *)(this->_fileData + (ulong)this->_filePos + 4);
      }
      DoRAMOfsPatches(this,memSize._2_1_,memSize._1_1_,&local_20,(UINT32 *)((long)&dataPtr + 4));
      (*pCVar8->romWrite)((pCVar8->base).defInf.dataPtr,local_20,dataPtr._4_4_,(UINT8 *)cDev);
    }
  }
  this->_filePos = dataOfs + this->_filePos;
  return;
}

Assistant:

void VGMPlayer::Cmd_DataBlock(void)
{
	UINT8 dblkType;
	UINT8 chipType;
	UINT8 chipID;
	UINT32 dblkLen;
	UINT32 memSize;
	UINT32 dataOfs;
	UINT32 dataLen;
	const UINT8* dataPtr;
	CHIP_DEVICE* cDev;
	
	dblkType = fData[0x02];
	dblkLen = ReadLE32(&fData[0x03]);
	chipID = (dblkLen & 0x80000000) >> 31;
	dblkLen &= 0x7FFFFFFF;
	_filePos += 0x07;
	
	switch(dblkType & 0xC0)
	{
	case 0x00:	// uncompressed data block
	case 0x40:	// compressed data block
		if (_curLoop > 0)
			return;	// skip during the 2nd/3rd/... loop, as these blocks were already loaded
		
		if (dblkType == 0x7F)
		{
			ReadPCMComprTable(dblkLen, &fData[0x00], &_pcmComprTbl);
		}
		else
		{
			PCM_BANK* pcmBnk = &_pcmBank[dblkType & 0x3F];
			PCM_CDB_INF dbCI;
			UINT32 oldLen = (UINT32)pcmBnk->data.size();
			dataLen = dblkLen;
			dataPtr = &fData[0x00];
			
			if (dblkType & 0x40)
			{
				ReadComprDataBlkHdr(dblkLen, dataPtr, &dbCI);
				dbCI.cmprInfo.comprTbl = &_pcmComprTbl;
				dataLen = dbCI.decmpLen;
			}
			
			pcmBnk->bankOfs.push_back(oldLen);
			pcmBnk->bankSize.push_back(dataLen);
			
			pcmBnk->data.resize(oldLen + dataLen);
			if (dblkType & 0x40)
			{
				UINT8 retVal = DecompressDataBlk(dataLen, &pcmBnk->data[oldLen],
					dblkLen - dbCI.hdrSize, &dataPtr[dbCI.hdrSize], &dbCI.cmprInfo);
				if (retVal == 0x10)
					emu_logf(&_logger, PLRLOG_ERROR, "Error loading table-compressed data block! No table loaded!\n");
				else if (retVal == 0x11)
					emu_logf(&_logger, PLRLOG_ERROR, "Data block and loaded value table incompatible!\n");
				else if (retVal == 0x80)
					emu_logf(&_logger, PLRLOG_ERROR, "Unknown data block compression!\n");
			}
			else
			{
				memcpy(&pcmBnk->data[oldLen], dataPtr, dataLen);
			}
			
			// TODO: refresh DAC Stream pointers (call daccontrol_refresh_data)
		}
		break;
	case 0x80:	// ROM/RAM write
		chipType = _VGM_ROM_CHIPS[dblkType & 0x3F][0];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL)
			break;
		
		memSize = ReadLE32(&fData[0x00]);
		dataOfs = ReadLE32(&fData[0x04]);
		dataPtr = &fData[0x08];
		dataLen = dblkLen - 0x08;
		if (chipType == 0x1C && dataLen && (cDev->flags & 0x01))
		{
			// chip == ASIC 219 (ID 0x1C + flags 0x01): byte-swap sample data
			dataLen &= ~0x01;
			std::vector<UINT8> swpData(dataLen);
			for (UINT32 curPos = 0x00; curPos < dataLen; curPos += 0x02)
			{
				swpData[curPos + 0x00] = dataPtr[curPos + 0x01];
				swpData[curPos + 0x01] = dataPtr[curPos + 0x00];
			}
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, &swpData[0x00]);
		}
		else
		{
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, dataPtr);
		}
		break;
	case 0xC0:	// RAM Write
		chipType = _VGM_RAM_CHIPS[dblkType & 0x3F];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL || cDev->romWrite == NULL)
			break;
		
		if (! (dblkType & 0x20))
		{
			// C0..DF: 16-bit addressing
			dataOfs = ReadLE16(&fData[0x00]);
			dataLen = dblkLen - 0x02;
			dataPtr = &fData[0x02];
		}
		else
		{
			// E0..FF: 32-bit addressing
			dataOfs = ReadLE32(&fData[0x00]);
			dataLen = dblkLen - 0x04;
			dataPtr = &fData[0x04];
		}
		DoRAMOfsPatches(chipType, chipID, dataOfs, dataLen);
		cDev->romWrite(cDev->base.defInf.dataPtr, dataOfs, dataLen, dataPtr);
		break;
	}
	
	_filePos += dblkLen;
	return;
}